

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O3

void __thiscall Assimp::HMPImporter::InternReadFile_HMP5(HMPImporter *this)

{
  aiVector3D **__s;
  size_t __n;
  int iVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  aiMesh **ppaVar5;
  aiMesh *paVar6;
  ulong uVar7;
  aiVector3D *paVar8;
  aiNode *paVar9;
  uint *puVar10;
  ushort *puVar11;
  ushort *szPos;
  uint height;
  uint uVar12;
  uint width;
  ulong uVar13;
  aiVector3D *vOut;
  uchar *szCurrent;
  ushort *local_38;
  
  puVar2 = (this->super_MDLImporter).mBuffer;
  local_38 = (ushort *)(puVar2 + 0x54);
  ValidateHeader_HMP457(this);
  ((this->super_MDLImporter).pScene)->mNumMeshes = 1;
  ppaVar5 = (aiMesh **)operator_new__(8);
  ((this->super_MDLImporter).pScene)->mMeshes = ppaVar5;
  paVar6 = (aiMesh *)operator_new(0x520);
  paVar6->mPrimitiveTypes = 0;
  paVar6->mNumVertices = 0;
  paVar6->mNumFaces = 0;
  __s = &paVar6->mVertices;
  memset(__s,0,0xcc);
  paVar6->mBones = (aiBone **)0x0;
  paVar6->mMaterialIndex = 0;
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mNumAnimMeshes = 0;
  paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar6->mMethod = 0;
  (paVar6->mAABB).mMin.x = 0.0;
  (paVar6->mAABB).mMin.y = 0.0;
  (paVar6->mAABB).mMin.z = 0.0;
  (paVar6->mAABB).mMax.x = 0.0;
  (paVar6->mAABB).mMax.y = 0.0;
  (paVar6->mAABB).mMax.z = 0.0;
  memset(paVar6->mColors,0,0xa0);
  *((this->super_MDLImporter).pScene)->mMeshes = paVar6;
  iVar1 = *(int *)(puVar2 + 0x3c);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar1;
  uVar7 = SUB168(auVar3 * ZEXT816(0xc),0);
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0xc),8) == 0) {
    uVar13 = uVar7;
  }
  paVar8 = (aiVector3D *)operator_new__(uVar13);
  if (iVar1 == 0) {
    *__s = paVar8;
    paVar8 = (aiVector3D *)operator_new__(uVar13);
  }
  else {
    __n = ((uVar7 - 0xc) / 0xc) * 0xc + 0xc;
    memset(paVar8,0,__n);
    *__s = paVar8;
    paVar8 = (aiVector3D *)operator_new__(uVar13);
    memset(paVar8,0,__n);
  }
  paVar6->mNormals = paVar8;
  uVar7 = (ulong)((float)iVar1 / *(float *)(puVar2 + 0x2c));
  uVar13 = (ulong)*(float *)(puVar2 + 0x2c);
  CreateMaterial(this,puVar2 + 0x54,(uchar **)&local_38);
  puVar11 = local_38 + 0x12;
  width = (uint)uVar13;
  szPos = local_38 + (uVar13 & 0xffffffff) * (uVar7 & 0xffffffff) * 2 + 0x12;
  local_38 = puVar11;
  MDLImporter::SizeCheck(&this->super_MDLImporter,szPos);
  height = (uint)uVar7;
  if (height != 0) {
    paVar8 = paVar6->mVertices;
    vOut = paVar6->mNormals;
    uVar4 = 0;
    do {
      if (width != 0) {
        uVar12 = 0;
        do {
          paVar8->x = (float)uVar12 * *(float *)(puVar2 + 0x24);
          paVar8->y = *(float *)(puVar2 + 0x28) * (float)uVar4;
          paVar8->z = ((float)*puVar11 / 65535.0 + -0.5) * *(float *)(puVar2 + 0x24) * 8.0;
          MD2::LookupNormalIndex((uint8_t)puVar11[1],vOut);
          paVar8 = paVar8 + 1;
          vOut = vOut + 1;
          puVar11 = puVar11 + 2;
          uVar12 = uVar12 + 1;
        } while (width != uVar12);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != height);
  }
  if (*(int *)(puVar2 + 0x30) != 0) {
    GenerateTextureCoords(this,width,height);
  }
  CreateOutputFaceList(this,width,height);
  paVar9 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar9);
  ((this->super_MDLImporter).pScene)->mRootNode = paVar9;
  paVar9 = ((this->super_MDLImporter).pScene)->mRootNode;
  (paVar9->mName).length = 0xc;
  builtin_strncpy((paVar9->mName).data,"terrain_root",0xd);
  ((this->super_MDLImporter).pScene)->mRootNode->mNumMeshes = 1;
  puVar10 = (uint *)operator_new__(4);
  ((this->super_MDLImporter).pScene)->mRootNode->mMeshes = puVar10;
  *((this->super_MDLImporter).pScene)->mRootNode->mMeshes = 0;
  return;
}

Assistant:

void HMPImporter::InternReadFile_HMP5( )
{
    // read the file header and skip everything to byte 84
    const HMP::Header_HMP5* pcHeader = (const HMP::Header_HMP5*)mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(mBuffer+84);
    ValidateHeader_HMP457();

    // generate an output mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();

    pcMesh->mMaterialIndex = 0;
    pcMesh->mVertices = new aiVector3D[pcHeader->numverts];
    pcMesh->mNormals = new aiVector3D[pcHeader->numverts];

    const unsigned int height = (unsigned int)(pcHeader->numverts / pcHeader->fnumverts_x);
    const unsigned int width =  (unsigned int)pcHeader->fnumverts_x;

    // generate/load a material for the terrain
    CreateMaterial(szCurrent,&szCurrent);

    // goto offset 120, I don't know why ...
    // (fixme) is this the frame header? I assume yes since it starts with 2.
    szCurrent += 36;
    SizeCheck(szCurrent + sizeof(const HMP::Vertex_HMP7)*height*width);

    // now load all vertices from the file
    aiVector3D* pcVertOut = pcMesh->mVertices;
    aiVector3D* pcNorOut = pcMesh->mNormals;
    const HMP::Vertex_HMP5* src = (const HMP::Vertex_HMP5*) szCurrent;
    for (unsigned int y = 0; y < height;++y)
    {
        for (unsigned int x = 0; x < width;++x)
        {
            pcVertOut->x = x * pcHeader->ftrisize_x;
            pcVertOut->y = y * pcHeader->ftrisize_y;
            pcVertOut->z = (((float)src->z / 0xffff)-0.5f) * pcHeader->ftrisize_x * 8.0f;
            MD2::LookupNormalIndex(src->normals162index, *pcNorOut );
            ++pcVertOut;++pcNorOut;++src;
        }
    }

    // generate texture coordinates if necessary
    if (pcHeader->numskins)
        GenerateTextureCoords(width,height);

    // now build a list of faces
    CreateOutputFaceList(width,height);

    // there is no nodegraph in HMP files. Simply assign the one mesh
    // (no, not the one ring) to the root node
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("terrain_root");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
}